

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_double<double,fmt::FormatSpec>
          (BasicWriter<char> *this,double value,FormatSpec *spec)

{
  Alignment AVar1;
  Buffer<char> *pBVar2;
  char cVar3;
  uint uVar4;
  CharPtr pcVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  char cVar9;
  char *pcVar10;
  char *pcVar11;
  size_t __len;
  ulong __n;
  size_t __len_1;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  bool bVar16;
  char format [10];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  wchar_t wVar17;
  char local_3a [10];
  
  bVar15 = spec->type_;
  uVar7 = bVar15 - 0x41;
  if (uVar7 < 0x27) {
    if ((0x71UL >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_00125772;
      goto LAB_00125470;
    }
    bVar16 = true;
  }
  else {
LAB_00125772:
    if (bVar15 != 0) {
      internal::report_unknown_type
                ((char)((ulong)spec >> 0x38),
                 (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    bVar15 = 0x67;
LAB_00125470:
    bVar16 = false;
  }
  if ((long)value < 0) {
    value = -value;
    cVar9 = '-';
  }
  else if ((spec->flags_ & 1) == 0) {
    cVar9 = '\0';
  }
  else {
    cVar9 = '+';
    if ((spec->flags_ & 2) == 0) {
      cVar9 = ' ';
    }
  }
  if (NAN(value)) {
    pcVar11 = " nan";
    if (bVar16) {
      pcVar11 = " NAN";
    }
    pcVar10 = " nan";
    if (bVar16) {
      pcVar10 = " NAN";
    }
    pcVar10 = pcVar10 + 1;
    if (cVar9 != '\0') {
      pcVar10 = pcVar11;
    }
    uVar14 = (ulong)(cVar9 != '\0');
LAB_001254f3:
    pcVar5 = write_str<char>(this,pcVar10,uVar14 + 3,&spec->super_AlignSpec);
    if (cVar9 != '\0') {
      *pcVar5 = cVar9;
    }
    return;
  }
  if (INFINITY <= value) {
    pcVar11 = " inf";
    if (bVar16) {
      pcVar11 = " INF";
    }
    pcVar10 = " inf";
    if (bVar16) {
      pcVar10 = " INF";
    }
    uVar14 = (ulong)(cVar9 != '\0');
    pcVar10 = pcVar10 + 1;
    if (cVar9 != '\0') {
      pcVar10 = pcVar11;
    }
    goto LAB_001254f3;
  }
  pBVar2 = this->buffer_;
  sVar12 = pBVar2->size_;
  uVar7 = (spec->super_AlignSpec).super_WidthSpec.width_;
  if (cVar9 != '\0') {
    if (pBVar2->capacity_ < (uVar7 + (uVar7 == 0)) + sVar12) {
      (**pBVar2->_vptr_Buffer)();
    }
    bVar16 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar16) {
      uVar7 = 0;
    }
    sVar12 = sVar12 + 1;
  }
  local_3a[0] = '%';
  if ((spec->flags_ & 8) == 0) {
    pbVar6 = (byte *)(local_3a + 1);
  }
  else {
    pbVar6 = (byte *)(local_3a + 2);
    local_3a[1] = 0x23;
  }
  AVar1 = (spec->super_AlignSpec).align_;
  if (AVar1 != ALIGN_CENTER) {
    if (AVar1 == ALIGN_LEFT) {
      *pbVar6 = 0x2d;
      pbVar6 = pbVar6 + 1;
    }
    if (uVar7 != 0) {
      *pbVar6 = 0x2a;
      pbVar6 = pbVar6 + 1;
      goto LAB_0012559d;
    }
  }
  uVar7 = 0;
LAB_0012559d:
  if (-1 < spec->precision_) {
    pbVar6[0] = 0x2e;
    pbVar6[1] = 0x2a;
    pbVar6 = pbVar6 + 2;
  }
  *pbVar6 = bVar15;
  pbVar6[1] = 0;
  wVar17 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  uVar8 = 0;
  do {
    pcVar11 = this->buffer_->ptr_ + sVar12;
    uVar4 = internal::CharTraits<char>::format_float<double>
                      (pcVar11,this->buffer_->capacity_ - sVar12,local_3a,uVar7,spec->precision_,
                       value);
    if ((int)uVar4 < 0) {
      pBVar2 = this->buffer_;
      bVar16 = true;
      uVar4 = uVar8;
      if (pBVar2->capacity_ != 0xffffffffffffffff) {
        (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->capacity_ + 1);
      }
    }
    else {
      uVar14 = this->buffer_->capacity_;
      if (uVar4 + sVar12 < uVar14) {
        bVar16 = false;
      }
      else {
        bVar16 = true;
        if (uVar14 < uVar4 + sVar12 + 1) {
          (**this->buffer_->_vptr_Buffer)();
        }
      }
    }
    uVar8 = uVar4;
  } while (bVar16);
  if (cVar9 == '\0') {
    cVar9 = '\0';
  }
  else {
    AVar1 = (spec->super_AlignSpec).align_;
    if (((AVar1 != ALIGN_RIGHT) && (AVar1 != ALIGN_DEFAULT)) ||
       (cVar3 = (char)wVar17, *pcVar11 != ' ')) {
      cVar3 = cVar9;
      cVar9 = '\0';
    }
    pcVar11[-1] = cVar3;
    uVar4 = uVar4 + 1;
  }
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar7 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar4 < uVar7) {
      pBVar2 = this->buffer_;
      sVar12 = pBVar2->size_;
      uVar14 = sVar12 + uVar7;
      if (pBVar2->capacity_ < uVar14) {
        (**pBVar2->_vptr_Buffer)(pBVar2,uVar14);
      }
      pBVar2->size_ = uVar14;
      pcVar11 = this->buffer_->ptr_ + sVar12;
      uVar14 = (ulong)uVar4;
      memmove(pcVar11 + (uVar7 - uVar4 >> 1),pcVar11,uVar14);
      uVar7 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar13 = uVar7 - uVar14;
      __n = uVar13 >> 1;
      if (1 < uVar13) {
        memset(pcVar11,wVar17 & 0xffU,__n);
      }
      if (uVar7 == uVar4) {
        return;
      }
      memset(pcVar11 + uVar14 + __n,wVar17 & 0xffU,uVar13 - __n);
      return;
    }
  }
  if ((cVar9 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    cVar3 = *pcVar11;
    while (cVar3 == ' ') {
      *pcVar11 = (char)wVar17;
      cVar3 = pcVar11[1];
      pcVar11 = pcVar11 + 1;
    }
    if (cVar9 != '\0') {
      pcVar11[-1] = cVar9;
    }
  }
  pBVar2 = this->buffer_;
  uVar14 = (ulong)uVar4 + pBVar2->size_;
  if (pBVar2->capacity_ < uVar14) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar14);
  }
  pBVar2->size_ = uVar14;
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const Spec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}